

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void * luaM_growaux_(lua_State *L,void *block,int *size,size_t size_elems,int limit,char *errormsg)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = *size;
  if (iVar1 < (int)((uint)limit >> 1)) {
    limit = 4;
    if (4 < iVar1 * 2) {
      limit = iVar1 * 2;
    }
  }
  else if (limit <= iVar1) {
    luaG_runerror(L,errormsg);
  }
  if (0xfffffffffffffffd / size_elems < (ulong)(limit + 1)) {
    luaM_toobig(L);
  }
  pvVar2 = luaM_realloc_(L,block,(long)iVar1 * size_elems,(uint)limit * size_elems);
  *size = limit;
  return pvVar2;
}

Assistant:

static void*luaM_growaux_(lua_State*L,void*block,int*size,size_t size_elems,
int limit,const char*errormsg){
void*newblock;
int newsize;
if(*size>=limit/2){
if(*size>=limit)
luaG_runerror(L,errormsg);
newsize=limit;
}
else{
newsize=(*size)*2;
if(newsize<4)
newsize=4;
}
newblock=luaM_reallocv(L,block,*size,newsize,size_elems);
*size=newsize;
return newblock;
}